

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool anon_unknown.dwarf_27941::ScrollWhenDraggingOnVoid(ImVec2 *delta,ImGuiMouseButton mouse_button)

{
  float fVar1;
  ImGuiWindow *this;
  uint uVar2;
  long lVar3;
  bool held;
  bool hovered;
  ImRect local_30;
  
  lVar3 = ImGui::GetCurrentContext();
  this = *(ImGuiWindow **)(lVar3 + 0x1a88);
  hovered = false;
  held = false;
  if (*(int *)(lVar3 + 0x1ac4) == 0) {
    local_30 = ImGuiWindow::Rect(this);
    uVar2 = ImGuiWindow::GetID((char *)this,"##scrolldraggingoverlay");
    ImGui::ButtonBehavior(&local_30,uVar2,&hovered,&held,1);
    if ((held & 1U) != 0) {
      fVar1 = delta->x;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        ImGui::SetScrollX(this,fVar1 + *(float *)(this + 0x54));
      }
    }
    if ((held & 1U) != 0) {
      fVar1 = delta->y;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        ImGui::SetScrollY(this,fVar1 + *(float *)(this + 0x58));
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ScrollWhenDraggingOnVoid(const ImVec2& delta, ImGuiMouseButton mouse_button) {
    ImGuiContext& g = *ImGui::GetCurrentContext();
    ImGuiWindow* window = g.CurrentWindow;
    bool hovered = false;
    bool held = false;
    bool dragging = false;
    ImGuiButtonFlags button_flags = (mouse_button == 0) ? ImGuiButtonFlags_MouseButtonLeft : (mouse_button == 1) ? ImGuiButtonFlags_MouseButtonRight : ImGuiButtonFlags_MouseButtonMiddle;
    if (g.HoveredId == 0) // If nothing hovered so far in the frame (not same as IsAnyItemHovered()!)
        ImGui::ButtonBehavior(window->Rect(), window->GetID("##scrolldraggingoverlay"), &hovered, &held, button_flags);
    if (held && delta.x != 0.0f) {
        ImGui::SetScrollX(window, window->Scroll.x + delta.x);
    }
    if (held && delta.y != 0.0f) {
        ImGui::SetScrollY(window, window->Scroll.y + delta.y);
        dragging = true;
    }
    return dragging;
}